

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O1

boolean grddead(monst *grd)

{
  boolean bVar1;
  
  bVar1 = clear_fcorr(grd,'\x01');
  if (bVar1 != '\0') {
    return '\x01';
  }
  remove_monster(level,(int)grd->mx,(int)grd->my);
  newsym((int)grd->mx,(int)grd->my);
  place_monster(grd,0,0);
  *(undefined2 *)((long)&grd[1].data + 2) = *(undefined2 *)&grd->mx;
  bVar1 = clear_fcorr(grd,'\x01');
  return bVar1;
}

Assistant:

boolean grddead(struct monst *grd)
{
	boolean dispose = clear_fcorr(grd, TRUE);

	if (!dispose) {
		/* see comment by newpos in gd_move() */
		remove_monster(level, grd->mx, grd->my);
		newsym(grd->mx, grd->my);
		place_monster(grd, 0, 0);
		EGD(grd)->ogx = grd->mx;
		EGD(grd)->ogy = grd->my;
		dispose = clear_fcorr(grd, TRUE);
	}
	return dispose;
}